

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::is_empty(path *p,error_code *ec)

{
  int iVar1;
  uintmax_t uVar2;
  bool bVar3;
  file_status fs;
  directory_iterator iter;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar3 = false;
  detail::status_ex((path *)local_40,(error_code *)p,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (local_40._0_4_ == 3) {
      directory_iterator::directory_iterator((directory_iterator *)(local_40 + 8),p,ec);
      if (ec->_M_value == 0) {
        directory_iterator::directory_iterator((directory_iterator *)(local_30 + 8));
        iVar1 = path::compare((path *)(local_40._8_8_ + 0x38),(path *)(local_30._8_8_ + 0x38));
        bVar3 = iVar1 == 0;
        if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
        }
      }
      else {
        bVar3 = false;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_);
      }
    }
    else {
      uVar2 = file_size(p,ec);
      bVar3 = uVar2 == 0 && ec->_M_value == 0;
    }
  }
  return bVar3;
}

Assistant:

GHC_INLINE bool is_empty(const path& p, std::error_code& ec) noexcept
{
    auto fs = status(p, ec);
    if (ec) {
        return false;
    }
    if (is_directory(fs)) {
        directory_iterator iter(p, ec);
        if (ec) {
            return false;
        }
        return iter == directory_iterator();
    }
    else {
        auto sz = file_size(p, ec);
        if (ec) {
            return false;
        }
        return sz == 0;
    }
}